

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_encoder.hpp
# Opt level: O0

bool __thiscall
jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::
visit_null(basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>
           *this,semantic_tag param_2,ser_context *param_3,error_code *param_4)

{
  bool bVar1;
  reference pvVar2;
  size_t sVar3;
  vector<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
  *this_00;
  array<char,_4UL> *this_01;
  stream_sink<char> *in_RCX;
  char *in_RDX;
  undefined1 in_SIL;
  undefined8 in_RDI;
  vector<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
  *in_stack_ffffffffffffffd0;
  char ch;
  undefined7 in_stack_fffffffffffffff0;
  
  ch = (char)((ulong)in_RDI >> 0x38);
  bVar1 = std::
          vector<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
          ::empty((vector<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
                   *)in_RCX);
  if (!bVar1) {
    pvVar2 = std::
             vector<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
             ::back(in_stack_ffffffffffffffd0);
    bVar1 = encoding_context::is_array(pvVar2);
    if (bVar1) {
      pvVar2 = std::
               vector<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
               ::back(in_stack_ffffffffffffffd0);
      sVar3 = encoding_context::count(pvVar2);
      if (sVar3 != 0) {
        stream_sink<char>::push_back(in_RCX,ch);
      }
    }
  }
  null_constant();
  this_00 = (vector<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
             *)std::array<char,_4UL>::data((array<char,_4UL> *)0x219e5f);
  this_01 = null_constant();
  std::array<char,_4UL>::size(this_01);
  stream_sink<char>::append
            ((stream_sink<char> *)CONCAT17(in_SIL,in_stack_fffffffffffffff0),in_RDX,(size_t)in_RCX);
  bVar1 = std::
          vector<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
          ::empty((vector<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
                   *)in_RCX);
  if (!bVar1) {
    pvVar2 = std::
             vector<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
             ::back(this_00);
    encoding_context::increment_count(pvVar2);
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_null(semantic_tag, const ser_context&, std::error_code&) final
        {
            if (!stack_.empty() && stack_.back().is_array() && stack_.back().count() > 0)
            {
                sink_.push_back(',');
            }

            sink_.append(null_constant().data(), null_constant().size());

            if (!stack_.empty())
            {
                stack_.back().increment_count();
            }
            JSONCONS_VISITOR_RETURN;
        }